

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

size_t __thiscall fmt::v7::detail::count_code_points(detail *this,basic_string_view<char> s)

{
  char *pcVar1;
  size_t sVar2;
  size_t size;
  size_t i;
  size_t num_code_points;
  char *data;
  basic_string_view<char> s_local;
  
  s_local.data_ = s.data_;
  data = (char *)this;
  pcVar1 = basic_string_view<char>::data((basic_string_view<char> *)&data);
  i = 0;
  size = 0;
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&data);
  for (; size != sVar2; size = size + 1) {
    if (((int)pcVar1[size] & 0xc0U) != 0x80) {
      i = i + 1;
    }
  }
  return i;
}

Assistant:

inline size_t count_code_points(basic_string_view<char> s) {
  const char* data = s.data();
  size_t num_code_points = 0;
  for (size_t i = 0, size = s.size(); i != size; ++i) {
    if ((data[i] & 0xc0) != 0x80) ++num_code_points;
  }
  return num_code_points;
}